

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_1::
BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>::
logAndSetTestResult(BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
                    *this,vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                          *results)

{
  TestContext *pTVar1;
  undefined8 uVar2;
  TestLog *log;
  char *pcVar3;
  int precision;
  float fVar4;
  float local_9c;
  string local_90;
  string local_60;
  float local_3c;
  undefined8 uStack_38;
  float rate;
  float local_30;
  undefined8 local_24;
  UploadSampleAnalyzeResult analysis;
  vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
  *results_local;
  BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
  *this_local;
  
  analysis._4_8_ = results;
  log = tcu::TestContext::getLog
                  ((this->
                   super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
                   ).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  _uStack_38 = analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
                         (log,(vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                               *)analysis._4_8_,true);
  local_24 = uStack_38;
  uVar2 = local_24;
  analysis.transferRateMedian = local_30;
  if (this->m_resultType == RESULT_ASYMPTOTIC_TRANSFER_RATE) {
    local_9c = local_30;
  }
  else {
    local_24._0_4_ = (float)uStack_38;
    local_9c = (float)local_24;
  }
  local_3c = local_9c;
  local_24 = uVar2;
  fVar4 = std::numeric_limits<float>::infinity();
  if ((local_9c != fVar4) || (NAN(local_9c) || NAN(fVar4))) {
    pTVar1 = (this->
             super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
             ).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    de::floatToString_abi_cxx11_
              (&local_90,(de *)0x2,local_3c * 0.0009765625 * 0.0009765625,precision);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    tcu::TestContext::setTestResult(pTVar1,QP_TEST_RESULT_PASS,pcVar3);
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    pTVar1 = (this->
             super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
             ).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    de::floatToString_abi_cxx11_(&local_60,(de *)0x2,0.0,precision);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    tcu::TestContext::setTestResult(pTVar1,QP_TEST_RESULT_PASS,pcVar3);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

void BasicUploadCase<SampleType>::logAndSetTestResult (const std::vector<UploadSampleResult<SampleType> >& results)
{
	const UploadSampleAnalyzeResult	analysis	= analyzeSampleResults(m_testCtx.getLog(), results, true);

	// with small buffers, report the median transfer rate of the samples
	// with large buffers, report the expected preformance of infinitely large buffers
	const float						rate		= (m_resultType == RESULT_ASYMPTOTIC_TRANSFER_RATE) ? (analysis.transferRateAtInfinity) : (analysis.transferRateMedian);

	if (rate == std::numeric_limits<float>::infinity())
	{
		// sample times are 1) invalid or 2) timer resolution too low
		// report speed 0 bytes / s since real value cannot be determined
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString(0.0f, 2).c_str());
	}
	else
	{
		// report transfer rate in MB / s
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString(rate / 1024.0f / 1024.0f, 2).c_str());
	}
}